

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

void * __thiscall
btHashedOverlappingPairCache::removeOverlappingPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  long lVar1;
  btBroadphasePair *pbVar2;
  int *piVar3;
  btOverlappingPairCallback *pbVar4;
  int *piVar5;
  btBroadphaseProxy *pbVar6;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar7;
  int proxyId1;
  void *pvVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int proxyId2;
  int iVar14;
  btBroadphasePair *pbVar15;
  ulong uVar16;
  long lVar17;
  btBroadphaseProxy *pbVar18;
  
  gRemovePairs = gRemovePairs + 1;
  pbVar18 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar18 = proxy0;
    proxy0 = proxy1;
  }
  uVar11 = pbVar18->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar11 = ~(uVar11 << 0xf) + uVar11;
  uVar11 = ((int)uVar11 >> 10 ^ uVar11) * 9;
  uVar11 = (int)uVar11 >> 6 ^ uVar11;
  uVar11 = ~(uVar11 << 0xb) + uVar11;
  uVar16 = (long)(int)((int)uVar11 >> 0x10 ^ uVar11) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  iVar14 = (this->m_hashTable).m_data[uVar16];
  if (iVar14 != -1) {
    pbVar2 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pbVar2[iVar14].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pbVar15 = pbVar2 + iVar14, pbVar15->m_pProxy1->m_uniqueId == pbVar18->m_uniqueId))
      goto LAB_0013860f;
      iVar14 = (this->m_next).m_data[iVar14];
    } while (iVar14 != -1);
  }
  pbVar15 = (btBroadphasePair *)0x0;
LAB_0013860f:
  if (pbVar15 == (btBroadphasePair *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
      _vptr_btOverlappingPairCallback[8])(this,pbVar15,dispatcher);
    piVar5 = (this->m_hashTable).m_data + uVar16;
    iVar14 = *piVar5;
    iVar9 = -1;
    iVar12 = (int)((ulong)((long)pbVar15 - (long)(this->m_overlappingPairArray).m_data) >> 5);
    if (iVar14 != iVar12) {
      do {
        iVar9 = iVar14;
        iVar14 = (this->m_next).m_data[iVar9];
      } while (iVar14 != iVar12);
    }
    pvVar8 = (pbVar15->field_3).m_internalInfo1;
    piVar3 = (this->m_next).m_data;
    piVar10 = piVar3 + iVar9;
    if (iVar9 == -1) {
      piVar10 = piVar5;
    }
    *piVar10 = piVar3[iVar12];
    lVar17 = (long)(this->m_overlappingPairArray).m_size;
    lVar1 = lVar17 + -1;
    pbVar4 = this->m_ghostPairCallback;
    if (pbVar4 != (btOverlappingPairCallback *)0x0) {
      (*pbVar4->_vptr_btOverlappingPairCallback[3])(pbVar4,proxy0,pbVar18,dispatcher);
    }
    iVar14 = (int)lVar1;
    if (iVar14 != iVar12) {
      pbVar15 = (this->m_overlappingPairArray).m_data;
      pbVar2 = pbVar15 + lVar1;
      uVar11 = (pbVar15[lVar1].m_pProxy1)->m_uniqueId << 0x10 |
               (pbVar15[lVar1].m_pProxy0)->m_uniqueId;
      uVar11 = ~(uVar11 << 0xf) + uVar11;
      uVar11 = ((int)uVar11 >> 10 ^ uVar11) * 9;
      uVar11 = (int)uVar11 >> 6 ^ uVar11;
      uVar11 = ~(uVar11 << 0xb) + uVar11;
      uVar16 = (long)(int)((int)uVar11 >> 0x10 ^ uVar11) &
               (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar5 = (this->m_hashTable).m_data + uVar16;
      iVar9 = *piVar5;
      iVar13 = -1;
      if (iVar9 != iVar14) {
        do {
          iVar13 = iVar9;
          iVar9 = (this->m_next).m_data[iVar13];
        } while (iVar9 != iVar14);
      }
      piVar3 = (this->m_next).m_data;
      piVar10 = piVar3 + iVar13;
      if (iVar13 == -1) {
        piVar10 = piVar5;
      }
      *piVar10 = piVar3[lVar17 + -1];
      pbVar18 = pbVar2->m_pProxy0;
      pbVar6 = pbVar2->m_pProxy1;
      aVar7 = pbVar2->field_3;
      pbVar15[iVar12].m_algorithm = pbVar2->m_algorithm;
      *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar15[iVar12].m_algorithm + 1) = aVar7;
      pbVar15[iVar12].m_pProxy0 = pbVar18;
      pbVar15[iVar12].m_pProxy1 = pbVar6;
      piVar5 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar12] = piVar5[uVar16];
      piVar5[uVar16] = iVar12;
    }
    piVar5 = &(this->m_overlappingPairArray).m_size;
    *piVar5 = *piVar5 + -1;
  }
  return pvVar8;
}

Assistant:

void* btHashedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1,btDispatcher* dispatcher)
{
	gRemovePairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair,dispatcher);

	void* userData = pair->m_internalInfo1;

	btAssert(pair->m_pProxy0->getUid() == proxyId1);
	btAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}